

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Forward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  longdouble __r;
  TPZBaseMatrix *pTVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  complex<long_double> sum;
  int64_t c;
  complex<long_double> pivot;
  int64_t r;
  complex<long_double> *__y;
  undefined2 uVar5;
  undefined6 in_stack_fffffffffffffe62;
  undefined1 local_148 [64];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [72];
  long local_80;
  complex<long_double> local_78;
  long local_50;
  undefined1 local_48 [40];
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar2 == lVar3) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = 0;
    while( true ) {
      lVar3 = local_20;
      lVar4 = (**(code **)(*in_RDI + 0x60))();
      if (lVar4 <= lVar3) break;
      (**(code **)(*in_RDI + 0x120))(local_48,in_RDI,local_20,local_20);
      local_50 = 0;
      while( true ) {
        lVar3 = local_50;
        iVar2 = TPZBaseMatrix::Cols(local_18);
        if (iVar2 <= lVar3) break;
        __r = (longdouble)0;
        __y = SUB108(__r,0);
        uVar5 = (undefined2)((unkuint10)__r >> 0x40);
        std::complex<long_double>::complex(&local_78,__r,__r);
        for (local_80 = 0; pTVar1 = local_18, lVar4 = local_20, lVar3 = local_50,
            local_80 < local_20; local_80 = local_80 + 1) {
          (**(code **)(*in_RDI + 0x120))(local_c8,in_RDI,local_20,local_80);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (local_e8,local_18,local_80,local_50);
          std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe62,uVar5),__y);
          std::complex<long_double>::operator+=
                    ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe62,uVar5),__y);
        }
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_148,local_18,local_20,local_50)
        ;
        std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe62,uVar5),__y);
        std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe62,uVar5),__y);
        (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar1,lVar4,lVar3,local_108);
        local_50 = local_50 + 1;
      }
      local_20 = local_20 + 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}